

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_flipped_bit(BtorSimBitVector *bv,uint32_t pos)

{
  BtorSimBitVector *bv_00;
  
  bv_00 = btorsim_bv_copy(bv);
  btorsim_bv_set_bit(bv_00,pos,
                     (uint)(((&bv_00[1].width)[~(pos >> 5) + bv_00->len] >> (pos & 0x1f) & 1) == 0))
  ;
  set_rem_bits_to_zero(bv_00);
  return bv_00;
}

Assistant:

BtorSimBitVector *
btorsim_bv_flipped_bit (const BtorSimBitVector *bv, uint32_t pos)
{
  assert (bv);
  assert (bv->len > 0);
  assert (pos < bv->width);

  BtorSimBitVector *res;

  res = btorsim_bv_copy (bv);
  btorsim_bv_set_bit (res, pos, btorsim_bv_get_bit (res, pos) ? 0 : 1);
  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));

  return res;
}